

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> *field)

{
  pointer pEVar1;
  pointer pEVar2;
  size_type sVar3;
  unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> local_60;
  value_type local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
  local_50;
  Binding local_48;
  value_type local_20;
  Export *export_;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> *field_local;
  Module *this_local;
  
  export_ = (Export *)field;
  field_local = (unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                 *)this;
  pEVar1 = std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
           operator->(field);
  local_20 = &pEVar1->export_;
  pEVar2 = std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
           operator->(field);
  sVar3 = std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::size(&this->exports);
  Binding::Binding(&local_48,
                   &(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc
                   ,(Index)sVar3);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
       ::emplace<std::__cxx11::string&,wabt::Binding>
                 ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                   *)&this->export_bindings,&(pEVar1->export_).name,&local_48);
  local_58 = local_20;
  std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::push_back(&this->exports,&local_58);
  std::unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>>::
  unique_ptr<wabt::ExportModuleField,std::default_delete<wabt::ExportModuleField>,void>
            ((unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>> *)&local_60,field
            );
  intrusive_list<wabt::ModuleField>::push_back(&this->fields,&local_60);
  std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::~unique_ptr
            (&local_60);
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<ExportModuleField> field) {
  // Exported names are allowed to be empty.
  Export& export_ = field->export_;
  export_bindings.emplace(export_.name, Binding(field->loc, exports.size()));
  exports.push_back(&export_);
  fields.push_back(std::move(field));
}